

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gazetteer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::CoreMLModels::Gazetteer::Clear(Gazetteer *this)

{
  string *psVar1;
  Gazetteer *this_local;
  
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->language_,psVar1);
  psVar1 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::ClearToEmptyNoArena(&this->modelparameterdata_,psVar1)
  ;
  this->revision_ = 0;
  clear_ClassLabels(this);
  return;
}

Assistant:

void Gazetteer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.CoreMLModels.Gazetteer)
  language_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  modelparameterdata_.ClearToEmptyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  revision_ = 0u;
  clear_ClassLabels();
}